

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse.h
# Opt level: O3

size_t ZSTD_fseBitCost(FSE_CTable *ctable,uint *count,uint max)

{
  ushort uVar1;
  byte bVar2;
  size_t sVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  U32 tableSize;
  long lVar7;
  ulong uVar8;
  
  uVar1 = (ushort)*ctable;
  bVar2 = (byte)uVar1;
  lVar7 = 1;
  if (uVar1 != 0) {
    lVar7 = (long)(1 << (bVar2 - 1 & 0x1f));
  }
  sVar3 = 0xffffffffffffffff;
  if (max <= *(ushort *)((long)ctable + 2)) {
    uVar4 = 0;
    uVar8 = 0;
    do {
      iVar5 = (ctable[lVar7 + uVar4 * 2 + 2] >> 0x10) + 1;
      if ((ulong)count[uVar4] != 0) {
        uVar6 = iVar5 * 0x100 -
                (iVar5 * 0x1000000 +
                 (ctable[lVar7 + uVar4 * 2 + 2] + (1 << (bVar2 & 0x1f))) * -0x100 >> (bVar2 & 0x1f))
        ;
        if ((uint)uVar1 * 0x100 + 0x100 <= uVar6) {
          return 0xffffffffffffffff;
        }
        uVar8 = uVar8 + (ulong)uVar6 * (ulong)count[uVar4];
      }
      uVar4 = uVar4 + 1;
    } while (max + 1 != uVar4);
    sVar3 = uVar8 >> 8;
  }
  return sVar3;
}

Assistant:

MEM_STATIC void FSE_initCState(FSE_CState_t* statePtr, const FSE_CTable* ct)
{
    const void* ptr = ct;
    const U16* u16ptr = (const U16*) ptr;
    const U32 tableLog = MEM_read16(ptr);
    statePtr->value = (ptrdiff_t)1<<tableLog;
    statePtr->stateTable = u16ptr+2;
    statePtr->symbolTT = ct + 1 + (tableLog ? (1<<(tableLog-1)) : 1);
    statePtr->stateLog = tableLog;
}